

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::request_vote(raft_server *this,bool force_vote)

{
  atomic<int> *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __int_type_conflict _Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  srv_role sVar7;
  int32 iVar8;
  long *plVar9;
  element_type *peVar10;
  __int_type _Var11;
  _func_int **pp_Var12;
  element_type *peVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int32 iVar17;
  char *pcVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar19;
  undefined4 extraout_var_01;
  _func_int **pp_Var20;
  undefined4 extraout_var_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  msg_type type;
  undefined8 in_RDX;
  raft_server *this_01;
  undefined7 in_register_00000031;
  _Hash_node_base *p_Var21;
  log_val_type local_da;
  undefined1 local_d9;
  ptr<peer> pp;
  string local_c8;
  ptr<log_entry> fv_msg_le;
  undefined1 local_98 [32];
  ptr<req_msg> req;
  ptr<peer> local_68;
  rpc_handler *local_58;
  _func_int **local_50;
  _func_int **local_48;
  _func_int **local_40;
  _Hash_node_base *local_38;
  
  local_98._24_4_ = (undefined4)CONCAT71(in_register_00000031,force_vote);
  LOCK();
  paVar1 = &((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->voted_for_;
  _Var3 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = this->id_;
  UNLOCK();
  plVar9 = *(long **)&(((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_).
                      super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar9 + 0x20))
            (plVar9,(this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,in_RDX,_Var3);
  uVar4 = this->votes_responded_;
  uVar5 = this->votes_granted_;
  this->votes_responded_ = uVar4 + 1;
  this->votes_granted_ = uVar5 + 1;
  peVar10 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = this;
  local_98._16_8_ = this;
  if ((peVar10 != (element_type *)0x0) && (iVar15 = (*peVar10->_vptr_logger[7])(), 3 < iVar15)) {
    peVar10 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar6 = this->id_;
    sVar7 = (this->role_)._M_i;
    paVar2 = &local_c8.field_2;
    if (sVar7 == leader) {
      pcVar18 = local_c8.field_2._M_local_buf + 6;
      local_c8.field_2._M_allocated_capacity._0_6_ = 0x726500000000;
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x6461656c;
      local_c8._M_string_length = 6;
    }
    else if (sVar7 == candidate) {
      pcVar18 = local_c8.field_2._M_local_buf + 9;
      local_c8.field_2._M_allocated_capacity = 0x74616469646e6163;
      local_c8.field_2._M_local_buf[8] = 'e';
      local_c8._M_string_length = 9;
    }
    else if (sVar7 == follower) {
      pcVar18 = local_c8.field_2._M_local_buf + 8;
      local_c8.field_2._M_allocated_capacity = 0x7265776f6c6c6f66;
      local_c8._M_string_length = 8;
    }
    else {
      pcVar18 = local_c8.field_2._M_local_buf + 7;
      local_c8.field_2._M_allocated_capacity._0_7_ = 0x4e574f4e000000;
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x4e4b4e55;
      local_c8._M_string_length = 7;
    }
    *pcVar18 = '\0';
    _Var11 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    iVar15 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    iVar16 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    uVar19 = term_for_log(this,CONCAT44(extraout_var_00,iVar16) - 1);
    this_01 = (raft_server *)local_98._16_8_;
    msg_if_given_abi_cxx11_
              ((string *)&fv_msg_le,
               "[VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
               ,(ulong)uVar6,paVar2,_Var11,CONCAT44(extraout_var,iVar15) + -1,uVar19,
               (ulong)(uint)*(int32 *)(local_98._16_8_ + 0x40),(ulong)(uint)this->my_priority_);
    (*peVar10->_vptr_logger[8])
              (peVar10,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"request_vote",0xe9,&fv_msg_le);
    if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_98) {
      operator_delete(fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  iVar15 = this_01->votes_granted_;
  iVar17 = get_quorum_for_election(this_01);
  if (iVar17 < iVar15) {
    this_01->election_completed_ = true;
    become_leader(this_01);
  }
  else {
    p_Var21 = (this_01->peers_)._M_h._M_before_begin._M_nxt;
    if (p_Var21 != (_Hash_node_base *)0x0) {
      local_58 = &this_01->resp_handler_;
      local_40 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c44f0;
      local_48 = (_func_int **)&PTR__req_msg_005c4540;
      local_50 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c48d8;
      do {
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var21[2]._M_nxt;
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var21[3]._M_nxt;
        if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar14 = is_regular_member(this_01,&pp);
        if (bVar14) {
          _Var11 = (((this_01->state_).
                     super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   term_).super___atomic_base<unsigned_long>._M_i;
          iVar17 = (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->id_;
          iVar15 = (*((this_01->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[2])();
          pp_Var20 = (_func_int **)term_for_log(this_01,CONCAT44(extraout_var_01,iVar15) - 1);
          local_38 = p_Var21;
          iVar15 = (*((this_01->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[2])();
          pp_Var12 = (_func_int **)
                     (this_01->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var21 = local_38;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = local_40;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          iVar8 = this_01->id_;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count = (int)_Var11;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = (int)(_Var11 >> 0x20);
          *(undefined4 *)
           &req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
            ._vptr__Sp_counted_base = 1;
          *(int32 *)((long)&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar8;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = iVar17;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = local_48;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
          _vptr__Sp_counted_base = pp_Var20;
          *(long *)&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi[3]._M_use_count = CONCAT44(extraout_var_02,iVar15) + -1;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
          _vptr__Sp_counted_base = pp_Var12;
          *(undefined1 (*) [16])
           &req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]
            ._M_use_count = (undefined1  [16])0x0;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
          _M_use_count = 0;
          req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
          _M_weak_count = 0;
          if (local_98[0x18] != '\0') {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
            this_00->_M_use_count = 1;
            this_00->_M_weak_count = 1;
            this_00->_vptr__Sp_counted_base = local_50;
            local_98._28_4_ = 0;
            force_vote_msg::serialize((force_vote_msg *)&local_c8);
            local_da = custom;
            fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                      (&fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(log_entry **)&fv_msg_le,
                       (allocator<nuraft::log_entry> *)&local_d9,(int *)(local_98 + 0x1c),
                       (shared_ptr<nuraft::buffer> *)&local_c8,&local_da);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
            }
            std::
            vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->log_entries_,(value_type *)&fv_msg_le);
            if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          this_01 = (raft_server *)local_98._16_8_;
          peVar10 = (((ptr<logger> *)(local_98._16_8_ + 0x318))->
                    super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if ((peVar10 != (element_type *)0x0) &&
             (iVar15 = (*peVar10->_vptr_logger[7])(), 4 < iVar15)) {
            peVar10 = (((ptr<logger> *)((long)this_01 + 0x318))->
                      super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            msg_type_to_string_abi_cxx11_
                      (&local_c8,
                       (nuraft *)
                       (ulong)((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_msg_base).type_,type);
            msg_if_given_abi_cxx11_
                      ((string *)&fv_msg_le,"send %s to server %d with term %lu",
                       local_c8._M_dataplus._M_p,
                       (ulong)*(uint *)&(p_Var21[2]._M_nxt)->_M_nxt->_M_nxt,
                       (((((ptr<srv_state> *)((long)this_01 + 0x2d0))->
                         super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->term_).super___atomic_base<unsigned_long>._M_i);
            (*peVar10->_vptr_logger[8])
                      (peVar10,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_vote",0x10e,(string *)&fv_msg_le);
            if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)local_98) {
              operator_delete(fv_msg_le.
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
          }
          LOCK();
          bVar14 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   busy_flag_)._M_base._M_i == false;
          if (bVar14) {
            ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->busy_flag_).
            _M_base._M_i = true;
          }
          UNLOCK();
          if (bVar14) {
            local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ;
            if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_use_count =
                     (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_use_count =
                     (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
              }
            }
            peer::send_req(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &local_68,&req,local_58);
            if (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            peVar10 = (((ptr<logger> *)((long)this_01 + 0x318))->
                      super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if ((peVar10 != (element_type *)0x0) &&
               (iVar15 = (*peVar10->_vptr_logger[7])(), 2 < iVar15)) {
              peVar10 = (((ptr<logger> *)((long)this_01 + 0x318))->
                        super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              peVar13 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&fv_msg_le,"failed to send vote request: peer %d (%s) is busy",
                         (ulong)(uint)peVar13->id_,(peVar13->endpoint_)._M_dataplus._M_p);
              (*peVar10->_vptr_logger[8])
                        (peVar10,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_vote",0x113,(string *)&fv_msg_le);
              if (fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)local_98) {
                operator_delete(fv_msg_le.
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
              }
            }
          }
          if (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        p_Var21 = p_Var21->_M_nxt;
      } while (p_Var21 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

void raft_server::request_vote(bool force_vote) {
    state_->set_voted_for(id_);
    ctx_->state_mgr_->save_state(*state_);
    votes_granted_ += 1;
    votes_responded_ += 1;
    p_in("[VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    // is this the only server?
    if (votes_granted_ > get_quorum_for_election()) {
        election_completed_ = true;
        become_leader();
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::request_vote_request,
                             id_,
                             pp->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );
        if (force_vote) {
            // Add a special log entry to let receivers ignore the priority.

            // Force vote message, and wrap it using log_entry.
            ptr<force_vote_msg> fv_msg = cs_new<force_vote_msg>();
            ptr<log_entry> fv_msg_le =
                cs_new<log_entry>(0, fv_msg->serialize(), log_val_type::custom);

            // Ship it.
            req->log_entries().push_back(fv_msg_le);
        }
        p_db( "send %s to server %d with term %" PRIu64 "",
              msg_type_to_string(req->get_type()).c_str(),
              it->second->get_id(),
              state_->get_term() );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send vote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}